

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O0

ostream * test_detail::
          print_range<std::deque<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>
                    (ostream *stream,deque<unsigned_int,_std::allocator<unsigned_int>_> *range)

{
  anon_class_16_2_aa65ec36 __f;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *this;
  bool bVar1;
  reference value;
  uint *puVar2;
  ostream *poVar3;
  const_iterator local_e0;
  const_iterator local_c0;
  _Deque_iterator<unsigned_int,_const_unsigned_int_&,_const_unsigned_int_*> local_a0;
  const_iterator local_80;
  const_iterator local_60;
  const_iterator local_40;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *range_local;
  ostream *stream_local;
  
  local_20 = range;
  range_local = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)stream;
  std::operator<<(stream,"[");
  std::begin<std::deque<unsigned_int,std::allocator<unsigned_int>>>(&local_40,local_20);
  std::end<std::deque<unsigned_int,std::allocator<unsigned_int>>>(&local_60,local_20);
  bVar1 = std::operator!=(&local_40,&local_60);
  this = range_local;
  if (bVar1) {
    std::begin<std::deque<unsigned_int,std::allocator<unsigned_int>>>(&local_80,local_20);
    value = std::_Deque_iterator<unsigned_int,_const_unsigned_int_&,_const_unsigned_int_*>::
            operator*(&local_80);
    puVar2 = burst::identity_fn::operator()((identity_fn *)((long)&stream_local + 7),value);
    std::ostream::operator<<(this,*puVar2);
    std::begin<std::deque<unsigned_int,std::allocator<unsigned_int>>>(&local_c0,local_20);
    std::next<std::_Deque_iterator<unsigned_int,unsigned_int_const&,unsigned_int_const*>>
              (&local_a0,&local_c0,1);
    std::end<std::deque<unsigned_int,std::allocator<unsigned_int>>>(&local_e0,local_20);
    __f.proj = (identity_fn *)((long)&stream_local + 7);
    __f.stream = (ostream *)range_local;
    std::
    for_each<std::_Deque_iterator<unsigned_int,unsigned_int_const&,unsigned_int_const*>,test_detail::print_range<std::deque<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>(std::ostream&,std::deque<unsigned_int,std::allocator<unsigned_int>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              (&local_a0,&local_e0,__f);
  }
  poVar3 = std::operator<<((ostream *)range_local,"]");
  return poVar3;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }